

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_config(fglrx_ioctl_config *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  mmt_buf *buf_00;
  mmt_buf *buf_01;
  mmt_buf *local_40;
  
  uVar1 = d->unk00;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk00");
    if (iVar2 != 0) goto LAB_0024b534;
  }
  else {
LAB_0024b534:
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk04;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk04");
    if (iVar2 != 0) goto LAB_0024b57b;
  }
  else {
LAB_0024b57b:
    fprintf(_stdout,"%sunk04: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk08;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_0024b5bb;
  }
  else {
LAB_0024b5bb:
    fprintf(_stdout,"%sunk08: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->username_len;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("username_len");
    if (iVar2 != 0) goto LAB_0024b5fb;
  }
  else {
LAB_0024b5fb:
    fprintf(_stdout,"%susername_len: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->username == 0) {
    iVar2 = _fglrx_field_enabled("username");
    if (iVar2 == 0) goto LAB_0024b6bb;
    local_40 = (mmt_buf *)0x0;
    fprintf(_stdout,"%susername: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%susername: 0x%016lx",", ");
    if (0 < argc) {
      local_40 = find_ptr(d->username,args,argc);
      if (local_40 != (mmt_buf *)0x0) goto LAB_0024b6c4;
    }
    fputs(" [no data]",_stdout);
LAB_0024b6bb:
    local_40 = (mmt_buf *)0x0;
  }
LAB_0024b6c4:
  fglrx_pfx = ", ";
  uVar1 = d->namespace_len;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("namespace_len");
    if (iVar2 != 0) goto LAB_0024b6e3;
  }
  else {
LAB_0024b6e3:
    fprintf(_stdout,"%snamespace_len: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",", ",colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->namespace == 0) {
    iVar2 = _fglrx_field_enabled("namespace");
    if (iVar2 == 0) goto LAB_0024b7db;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%snamespace: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%snamespace: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->namespace,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024b7de;
    }
    fputs(" [no data]",_stdout);
LAB_0024b7db:
    buf = (mmt_buf *)0x0;
  }
LAB_0024b7de:
  fglrx_pfx = ", ";
  uVar1 = d->prop_name_len;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("prop_name_len");
    if (iVar2 != 0) goto LAB_0024b7fd;
  }
  else {
LAB_0024b7fd:
    fprintf(_stdout,"%sprop_name_len: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad2c != 0) {
    fprintf(_stdout,"%s%s_pad2c: 0x%08x%s",", ",colors->err,(ulong)d->_pad2c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->prop_name == 0) {
    iVar2 = _fglrx_field_enabled("prop_name");
    if (iVar2 == 0) goto LAB_0024b8f4;
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sprop_name: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sprop_name: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->prop_name,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024b8f6;
    }
    fputs(" [no data]",_stdout);
LAB_0024b8f4:
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024b8f6:
  fglrx_pfx = ", ";
  uVar1 = d->unk38;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk38");
    if (iVar2 != 0) goto LAB_0024b916;
  }
  else {
LAB_0024b916:
    fprintf(_stdout,"%sunk38: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk3c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk3c");
    if (iVar2 != 0) goto LAB_0024b958;
  }
  else {
LAB_0024b958:
    fprintf(_stdout,"%sunk3c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk40;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk40");
    if (iVar2 != 0) goto LAB_0024b99a;
  }
  else {
LAB_0024b99a:
    fprintf(_stdout,"%sunk40: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk44;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk44");
    if (iVar2 != 0) goto LAB_0024b9dc;
  }
  else {
LAB_0024b9dc:
    fprintf(_stdout,"%sunk44: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk48;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk48");
    if (iVar2 != 0) goto LAB_0024ba1e;
  }
  else {
LAB_0024ba1e:
    fprintf(_stdout,"%sunk48: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk4c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk4c");
    if (iVar2 != 0) goto LAB_0024ba60;
  }
  else {
LAB_0024ba60:
    fprintf(_stdout,"%sunk4c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->prop_value_len;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("prop_value_len");
    if (iVar2 != 0) goto LAB_0024baa2;
  }
  else {
LAB_0024baa2:
    fprintf(_stdout,"%sprop_value_len: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad54 != 0) {
    fprintf(_stdout,"%s%s_pad54: 0x%08x%s",", ",colors->err,(ulong)d->_pad54,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->prop_value == 0) {
    iVar2 = _fglrx_field_enabled("prop_value");
    if (iVar2 != 0) {
      buf_01 = (mmt_buf *)0x0;
      fprintf(_stdout,"%sprop_value: %s",", ","NULL");
      goto LAB_0024bb9c;
    }
  }
  else {
    fprintf(_stdout,"%sprop_value: 0x%016lx",", ");
    if (0 < argc) {
      buf_01 = find_ptr(d->prop_value,args,argc);
      if (buf_01 != (mmt_buf *)0x0) goto LAB_0024bb9c;
    }
    fputs(" [no data]",_stdout);
  }
  buf_01 = (mmt_buf *)0x0;
LAB_0024bb9c:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_40 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_40,"username");
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf,"namespace");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_00,"prop_name");
  }
  if (buf_01 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_01,"prop_value");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_config(struct fglrx_ioctl_config *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_d32(d, username_len);
	struct mmt_buf *data1 = fglrx_print_ptr(d, username, args, argc);
	fglrx_print_d32(d, namespace_len);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, namespace, args, argc);
	fglrx_print_d32(d, prop_name_len);
	fglrx_print_pad_x32(d, _pad2c);
	struct mmt_buf *data3 = fglrx_print_ptr(d, prop_name, args, argc);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_d32(d, prop_value_len);
	fglrx_print_pad_x32(d, _pad54);
	struct mmt_buf *data4 = fglrx_print_ptr(d, prop_value, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "username");
	if (data2)
		dump_mmt_buf_as_text(data2, "namespace");
	if (data3)
		dump_mmt_buf_as_text(data3, "prop_name");
	if (data4)
		dump_mmt_buf_as_text(data4, "prop_value");
}